

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_session.c
# Opt level: O3

oonf_layer2_neigh * dlep_session_get_l2_from_neighbor(dlep_local_neighbor *dlep_neigh)

{
  avl_tree *tree;
  avl_node *paVar1;
  char *pcVar2;
  int line;
  oonf_log_source source;
  oonf_log_severity severity;
  char *format;
  oonf_layer2_neigh_key_str nbuf;
  
  pcVar2 = (dlep_neigh->session->l2_listener).name;
  tree = oonf_layer2_get_net_tree();
  paVar1 = avl_find(tree,pcVar2);
  if (paVar1 == (avl_node *)0x0) {
    source = dlep_neigh->session->log_source;
    if ((log_global_mask[source] & 1) != 0) {
      format = "Could not find l2net %s for new neighbor";
      severity = LOG_SEVERITY_DEBUG;
      line = 0x224;
      pcVar2 = (dlep_neigh->session->l2_listener).name;
      goto LAB_001210a4;
    }
  }
  else {
    paVar1 = avl_find((avl_tree *)&paVar1[-0x21].key,&dlep_neigh->neigh_key);
    if (paVar1 != (avl_node *)0x0) {
      return (oonf_layer2_neigh *)&paVar1[-0x16].parent;
    }
    source = dlep_neigh->session->log_source;
    if ((log_global_mask[source] & 2) != 0) {
      pcVar2 = oonf_layer2_neigh_key_to_string(&nbuf,&dlep_neigh->neigh_key,true);
      format = "Could not find l2neigh for neighbor %s";
      severity = LOG_SEVERITY_INFO;
      line = 0x22c;
LAB_001210a4:
      oonf_log(severity,source,"src/generic/dlep/dlep_session.c",line,(void *)0x0,0,format,pcVar2);
      return (oonf_layer2_neigh *)0x0;
    }
  }
  return (oonf_layer2_neigh *)0x0;
}

Assistant:

struct oonf_layer2_neigh *
dlep_session_get_l2_from_neighbor(struct dlep_local_neighbor *dlep_neigh) {
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_net *l2net;
#ifdef OONF_LOG_INFO
  union oonf_layer2_neigh_key_str nbuf;
#endif

  l2net = oonf_layer2_net_get(dlep_neigh->session->l2_listener.name);
  if (!l2net) {
    OONF_DEBUG(dlep_neigh->session->log_source, "Could not find l2net %s for new neighbor",
      dlep_neigh->session->l2_listener.name);
    return NULL;
  }

  l2neigh = oonf_layer2_neigh_get_lid(l2net, &dlep_neigh->neigh_key);
  if (!l2neigh) {
    OONF_INFO(dlep_neigh->session->log_source,
      "Could not find l2neigh for neighbor %s",
      oonf_layer2_neigh_key_to_string(&nbuf, &dlep_neigh->neigh_key, true));
    return NULL;
  }
  return l2neigh;
}